

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *create_info,
          ScratchAllocator *alloc)

{
  VkDescriptorBindingFlags *pVVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  void *pvVar4;
  size_t size;
  
  puVar3 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar3 != (undefined8 *)0x0) {
    uVar2 = *(undefined8 *)create_info;
    pvVar4 = create_info->pNext;
    pVVar1 = create_info->pBindingFlags;
    puVar3[2] = *(undefined8 *)&create_info->bindingCount;
    puVar3[3] = pVVar1;
    *puVar3 = uVar2;
    puVar3[1] = pvVar4;
  }
  if (puVar3[3] == 0) {
    return puVar3;
  }
  if ((ulong)create_info->bindingCount != 0) {
    pVVar1 = create_info->pBindingFlags;
    size = (ulong)create_info->bindingCount << 2;
    pvVar4 = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (pvVar4 != (void *)0x0) {
      memmove(pvVar4,pVVar1,size);
      goto LAB_00127e19;
    }
  }
  pvVar4 = (void *)0x0;
LAB_00127e19:
  puVar3[3] = pvVar4;
  return puVar3;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkDescriptorSetLayoutBindingFlagsCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *info = copy(create_info, 1, alloc);
	if (info->pBindingFlags)
		info->pBindingFlags = copy(create_info->pBindingFlags, create_info->bindingCount, alloc);
	return info;
}